

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::pushError(Reader *this,Value *value,string *message,Value *extra)

{
  Location pCVar1;
  Location pCVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  undefined1 local_70 [24];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  Location local_38;
  
  uVar5 = (long)this->end_ - (long)this->begin_;
  sVar3 = Value::getOffsetStart(value);
  if (((sVar3 <= uVar5) && (sVar3 = Value::getOffsetLimit(value), sVar3 <= uVar5)) &&
     (sVar3 = Value::getOffsetLimit(extra), sVar3 <= uVar5)) {
    pCVar1 = this->begin_;
    sVar3 = Value::getOffsetStart(value);
    pCVar2 = this->begin_;
    sVar4 = Value::getOffsetLimit(value);
    local_70._16_8_ = pCVar2 + sVar4;
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_70._0_4_ = tokenError;
    local_70._8_8_ = pCVar1 + sVar3;
    std::__cxx11::string::_M_assign((string *)&local_58);
    pCVar1 = this->begin_;
    sVar3 = Value::getOffsetStart(extra);
    local_38 = pCVar1 + sVar3;
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::push_back
              (&this->errors_,(value_type *)local_70);
    std::__cxx11::string::~string((string *)&local_58);
    return true;
  }
  return false;
}

Assistant:

bool Reader::pushError(const Value& value, const std::string& message, const Value& extra) {
  size_t length = end_ - begin_;
  if(value.getOffsetStart() > length
    || value.getOffsetLimit() > length
    || extra.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = begin_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = begin_ + extra.getOffsetStart();
  errors_.push_back(info);
  return true;
}